

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 add_reg_for_lit(DisasContext_conflict1 *s,int reg,int ofs)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *a1;
  
  s_00 = s->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  if (reg == 0xf) {
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)a1,
                        (long)(int)(((int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4 & 0xfffffffc) +
                                   ofs));
  }
  else {
    tcg_gen_addi_i32_aarch64(s_00,(TCGv_i32)((long)a1 - (long)s_00),s_00->cpu_R[reg],ofs);
  }
  return (TCGv_i32)((long)a1 - (long)s_00);
}

Assistant:

static TCGv_i32 add_reg_for_lit(DisasContext *s, int reg, int ofs)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);

    if (reg == 15) {
        tcg_gen_movi_i32(tcg_ctx, tmp, (read_pc(s) & ~3) + ofs);
    } else {
        tcg_gen_addi_i32(tcg_ctx, tmp, tcg_ctx->cpu_R[reg], ofs);
    }
    return tmp;
}